

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::one_thread::impl::
data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::set_data_sources_name_base
          (data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,string *name_base,void *disp_this_pointer)

{
  prefix_t local_ac;
  string local_70 [32];
  prefix_t local_50;
  void *local_20;
  void *disp_this_pointer_local;
  string *name_base_local;
  data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *this_local;
  
  local_20 = disp_this_pointer;
  disp_this_pointer_local = name_base;
  name_base_local = (string *)this;
  std::__cxx11::string::string(local_70,(string *)name_base);
  reuse::make_disp_prefix(&local_50,"ot",(string *)local_70,local_20);
  memcpy(&this->
          super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
         ,&local_50,0x30);
  std::__cxx11::string::~string(local_70);
  reuse::make_disp_working_thread_prefix
            (&local_ac,
             &(this->
              super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
              ).m_base_prefix,0);
  memcpy(&(this->
          super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
          ).m_work_thread_prefix,&local_ac,0x30);
  return;
}

Assistant:

void
		set_data_sources_name_base(
			const std::string & name_base,
			const void * disp_this_pointer )
			{
				using namespace so_5::disp::reuse;

				this->m_base_prefix = make_disp_prefix(
						"ot", // ot -- one_thread
						name_base,
						disp_this_pointer );

				this->m_work_thread_prefix = make_disp_working_thread_prefix(
						this->m_base_prefix,
						0 );
			}